

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O3

size_t portability_path_canonical(char *path,size_t path_size,char *canonical,size_t canonical_size)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (canonical == (char *)0x0 || path == (char *)0x0) {
    return 0;
  }
  if (canonical_size == 0 || *path != '.') {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar3 = 0;
    do {
      if (path[uVar4 + 1] == '/') {
        uVar4 = uVar4 + 1;
LAB_00101852:
        uVar3 = 0;
      }
      else {
        if ((path[uVar4 + 1] == '.') && (path[uVar4 + 2] == '/')) {
          uVar4 = uVar4 + 2;
          goto LAB_00101852;
        }
        canonical[uVar3] = '.';
        uVar3 = uVar3 + 1;
      }
      lVar2 = uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while ((path[lVar2] == '.') && (uVar3 < canonical_size));
  }
  if (uVar3 < canonical_size && uVar4 < path_size) {
    do {
      if (path[uVar4] == '.') {
        uVar5 = uVar4 + 1;
        cVar1 = path[uVar4 + 1];
        if (cVar1 == '\0') {
          uVar3 = (uVar3 - 1) + (ulong)(uVar3 < 2);
          uVar4 = uVar5;
        }
        else if (cVar1 == '/') {
          if (path[uVar4 + 2] == '.') {
            bVar6 = uVar3 == 0;
            uVar3 = uVar3 - 1;
            uVar4 = uVar5;
            if (bVar6) {
              uVar3 = 0;
            }
          }
          else {
LAB_001018d7:
            uVar4 = uVar4 + 2;
          }
        }
        else if (cVar1 == '.') {
          if (2 < uVar3) {
            uVar3 = uVar3 - 2;
            do {
              if (canonical[uVar3] == '/') goto LAB_001018d7;
              uVar3 = uVar3 - 1;
            } while (uVar3 != 0);
            uVar3 = 0;
            goto LAB_001018d7;
          }
          uVar5 = uVar4 + 3;
          if (path[uVar4 + 3] == '.') {
            uVar5 = uVar4 + 2;
          }
          uVar3 = 0;
          uVar4 = uVar5;
        }
      }
      canonical[uVar3] = path[uVar4];
      uVar3 = uVar3 + 1;
      uVar4 = uVar4 + 1;
    } while ((uVar4 < path_size) && (uVar3 < canonical_size));
  }
  return uVar3;
}

Assistant:

size_t portability_path_canonical(const char *path, size_t path_size, char *canonical, size_t canonical_size)
{
	if (path == NULL || canonical == NULL)
	{
		return 0;
	}

	size_t iterator, size = 0;
	int separator_found = 1;
	char separator = PORTABILITY_PATH_SEPARATOR_C; /* Use current platform style as default */

	/* Standarize the separators */
	for (iterator = 0; iterator < path_size; ++iterator)
	{
		if (PORTABILITY_PATH_SEPARATOR(path[iterator]))
		{
			separator_found = 0;
			separator = path[iterator];
			break;
		}
	}

	/* Remove first dots */
	for (iterator = 0; path[iterator] == '.' && size < canonical_size; ++iterator)
	{
		size_t next_first = iterator + 1;
		size_t next_second = iterator + 2;

		if (PORTABILITY_PATH_SEPARATOR(path[next_first]))
		{
			++iterator;
			size = 0;
		}
		else if (path[next_first] == '.' && PORTABILITY_PATH_SEPARATOR(path[next_second]))
		{
			iterator += 2;
			size = 0;
		}
		else
		{
			canonical[size++] = path[iterator];
		}
	}

	/* Canonicalize the path */
	for (/* void */; iterator < path_size && size < canonical_size; ++iterator)
	{
		if (path[iterator] == '.')
		{
			size_t next = iterator + 1;

			if (path[next] == '.')
			{
				if (size > 2)
				{
					size -= 2;

					while (size > 0 && !PORTABILITY_PATH_SEPARATOR(canonical[size]))
					{
						--size;
					}

					iterator += 2;
				}
				else
				{
					size = 0;

					if (path[iterator + 3] == '.')
					{
						iterator += 2;
					}
					else
					{
						iterator += 3;
					}
				}
			}
			else if (PORTABILITY_PATH_SEPARATOR(path[next]))
			{
				if (path[next + 1] == '.')
				{
					iterator += 1;

					if (size > 0)
					{
						--size;
					}
				}
				else
				{
					iterator += 2;
				}
			}
			else if (path[next] == '\0')
			{
				if (size > 1)
				{
					--size;
				}

				++iterator;
			}
		}

		/* Store the correct separator */
		canonical[size++] = PORTABILITY_PATH_SEPARATOR(path[iterator]) && separator_found == 0 ? separator : path[iterator];
	}

	return size;
}